

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O3

void compute_integral_img_simd_int(uint8_t *gray_image,integral_image *iimage)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined8 uVar17;
  uint uVar18;
  byte bVar19;
  byte bVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  float fVar24;
  int iVar25;
  float *pfVar26;
  uint8_t *puVar27;
  float *pfVar28;
  uint uVar29;
  ulong uVar30;
  float *pfVar31;
  long lVar32;
  ulong uVar33;
  ushort uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  
  auVar16 = _DAT_001a56a0;
  uVar1 = iimage->width;
  uVar22 = (ulong)(int)uVar1;
  lVar21 = (long)iimage->data_width;
  uVar2 = iimage->height;
  pfVar28 = iimage->data;
  uVar29 = uVar1 + 3;
  uVar18 = uVar1;
  if ((long)uVar22 < 0) {
    uVar18 = uVar29;
  }
  if (uVar29 < 7) {
    uVar30 = 0;
  }
  else {
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    uVar30 = 0;
    do {
      auVar36 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16,
                                  ZEXT432(*(uint *)(gray_image + uVar30)));
      auVar36 = vpsadbw_avx2(auVar36,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar36 = vpaddd_avx2(auVar36,auVar37._0_32_);
      auVar35 = vpmovqd_avx512vl(auVar36);
      *(undefined1 (*) [16])(pfVar28 + uVar30) = auVar35;
      auVar36 = vpermq_avx2(auVar36,0xff);
      auVar37 = ZEXT3264(auVar36);
      uVar30 = uVar30 + 4;
    } while (uVar30 < (ulong)(long)(int)(uVar18 & 0xfffffffc));
  }
  if (uVar30 < uVar22) {
    fVar24 = pfVar28[uVar30 - 1];
    do {
      fVar24 = (float)((int)fVar24 + (uint)gray_image[uVar30]);
      pfVar28[uVar30] = fVar24;
      uVar30 = uVar30 + 1;
    } while (uVar22 != uVar30);
  }
  auVar16 = _DAT_001a56a0;
  if (1 < uVar2) {
    puVar27 = gray_image + uVar22;
    lVar32 = 1;
    pfVar31 = pfVar28;
    pfVar26 = pfVar28;
    do {
      pfVar26 = pfVar26 + lVar21;
      if (uVar29 < 7) {
        uVar30 = 0;
      }
      else {
        auVar37 = ZEXT1664((undefined1  [16])0x0);
        uVar30 = 0;
        do {
          auVar36 = vpermt2b_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16,
                                      ZEXT432(*(uint *)(puVar27 + uVar30)));
          auVar36 = vpsadbw_avx2(auVar36,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
          auVar36 = vpaddd_avx2(auVar36,auVar37._0_32_);
          auVar35 = vpmovqd_avx512vl(auVar36);
          auVar35 = vpaddd_avx(auVar35,*(undefined1 (*) [16])(pfVar31 + uVar30));
          auVar36 = vpermq_avx2(auVar36,0xff);
          auVar37 = ZEXT3264(auVar36);
          *(undefined1 (*) [16])(pfVar26 + uVar30) = auVar35;
          uVar30 = uVar30 + 4;
        } while (uVar30 < (ulong)(long)(int)(uVar18 & 0xfffffffc));
      }
      lVar23 = (lVar32 + -1) * lVar21;
      if (uVar30 < uVar22) {
        iVar25 = (int)pfVar28[lVar32 * lVar21 + (uVar30 - 1)] - (int)pfVar28[lVar23 + (uVar30 - 1)];
        do {
          iVar25 = iVar25 + (uint)puVar27[uVar30];
          pfVar28[lVar32 * lVar21 + uVar30] = (float)((int)pfVar28[lVar23 + uVar30] + iVar25);
          uVar30 = uVar30 + 1;
        } while (uVar30 != uVar22);
      }
      lVar32 = lVar32 + 1;
      pfVar31 = pfVar31 + lVar21;
      puVar27 = puVar27 + uVar22;
    } while (lVar32 != (int)uVar2);
  }
  if (uVar2 != 0) {
    auVar37 = vbroadcastss_avx512f(ZEXT416(0x3b808081));
    auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    lVar32 = 0;
    pfVar26 = iimage->data;
    do {
      uVar30 = 0;
      if (uVar1 - 7 != 0) {
        do {
          auVar16 = vcvtdq2ps_avx(*(undefined1 (*) [32])(pfVar28 + uVar30));
          pfVar31 = pfVar26 + uVar30;
          *pfVar31 = auVar16._0_4_ * 0.003921569;
          pfVar31[1] = auVar16._4_4_ * 0.003921569;
          pfVar31[2] = auVar16._8_4_ * 0.003921569;
          pfVar31[3] = auVar16._12_4_ * 0.003921569;
          pfVar31[4] = auVar16._16_4_ * 0.003921569;
          pfVar31[5] = auVar16._20_4_ * 0.003921569;
          pfVar31[6] = auVar16._24_4_ * 0.003921569;
          pfVar31[7] = auVar16._28_4_;
          uVar30 = uVar30 + 8;
        } while (uVar30 < (ulong)(long)(int)(uVar1 - 7));
      }
      if (uVar30 <= uVar22 && uVar22 - uVar30 != 0) {
        uVar33 = 0;
        auVar40 = vpbroadcastq_avx512f();
        do {
          auVar41 = vpbroadcastq_avx512f();
          auVar42 = vporq_avx512f(auVar41,auVar38);
          auVar41 = vporq_avx512f(auVar41,auVar39);
          uVar17 = vpcmpuq_avx512f(auVar41,auVar40,2);
          bVar19 = (byte)uVar17;
          uVar17 = vpcmpuq_avx512f(auVar42,auVar40,2);
          bVar20 = (byte)uVar17;
          uVar34 = CONCAT11(bVar20,bVar19);
          auVar41 = vmovdqu32_avx512f(*(undefined1 (*) [64])(pfVar28 + uVar30 + uVar33));
          auVar42._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * auVar41._4_4_;
          auVar42._0_4_ = (uint)(bVar19 & 1) * auVar41._0_4_;
          auVar42._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * auVar41._8_4_;
          auVar42._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * auVar41._12_4_;
          auVar42._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * auVar41._16_4_;
          auVar42._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * auVar41._20_4_;
          auVar42._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * auVar41._24_4_;
          auVar42._28_4_ = (uint)((byte)(uVar34 >> 7) & 1) * auVar41._28_4_;
          auVar42._32_4_ = (uint)(bVar20 & 1) * auVar41._32_4_;
          auVar42._36_4_ = (uint)(bVar20 >> 1 & 1) * auVar41._36_4_;
          auVar42._40_4_ = (uint)(bVar20 >> 2 & 1) * auVar41._40_4_;
          auVar42._44_4_ = (uint)(bVar20 >> 3 & 1) * auVar41._44_4_;
          auVar42._48_4_ = (uint)(bVar20 >> 4 & 1) * auVar41._48_4_;
          auVar42._52_4_ = (uint)(bVar20 >> 5 & 1) * auVar41._52_4_;
          auVar42._56_4_ = (uint)(bVar20 >> 6 & 1) * auVar41._56_4_;
          auVar42._60_4_ = (uint)(bVar20 >> 7) * auVar41._60_4_;
          auVar41 = vcvtudq2ps_avx512f(auVar42);
          auVar41 = vmulps_avx512f(auVar41,auVar37);
          pfVar31 = pfVar26 + uVar30 + uVar33;
          bVar3 = (bool)((byte)(uVar34 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar34 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar34 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar34 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar34 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar34 >> 6) & 1);
          bVar9 = (bool)((byte)(uVar34 >> 7) & 1);
          bVar10 = (bool)(bVar20 >> 1 & 1);
          bVar11 = (bool)(bVar20 >> 2 & 1);
          bVar12 = (bool)(bVar20 >> 3 & 1);
          bVar13 = (bool)(bVar20 >> 4 & 1);
          bVar14 = (bool)(bVar20 >> 5 & 1);
          bVar15 = (bool)(bVar20 >> 6 & 1);
          *pfVar31 = (float)((uint)(bVar19 & 1) * auVar41._0_4_ |
                            (uint)!(bool)(bVar19 & 1) * (int)*pfVar31);
          pfVar31[1] = (float)((uint)bVar3 * auVar41._4_4_ | (uint)!bVar3 * (int)pfVar31[1]);
          pfVar31[2] = (float)((uint)bVar4 * auVar41._8_4_ | (uint)!bVar4 * (int)pfVar31[2]);
          pfVar31[3] = (float)((uint)bVar5 * auVar41._12_4_ | (uint)!bVar5 * (int)pfVar31[3]);
          pfVar31[4] = (float)((uint)bVar6 * auVar41._16_4_ | (uint)!bVar6 * (int)pfVar31[4]);
          pfVar31[5] = (float)((uint)bVar7 * auVar41._20_4_ | (uint)!bVar7 * (int)pfVar31[5]);
          pfVar31[6] = (float)((uint)bVar8 * auVar41._24_4_ | (uint)!bVar8 * (int)pfVar31[6]);
          pfVar31[7] = (float)((uint)bVar9 * auVar41._28_4_ | (uint)!bVar9 * (int)pfVar31[7]);
          pfVar31[8] = (float)((uint)(bVar20 & 1) * auVar41._32_4_ |
                              (uint)!(bool)(bVar20 & 1) * (int)pfVar31[8]);
          pfVar31[9] = (float)((uint)bVar10 * auVar41._36_4_ | (uint)!bVar10 * (int)pfVar31[9]);
          pfVar31[10] = (float)((uint)bVar11 * auVar41._40_4_ | (uint)!bVar11 * (int)pfVar31[10]);
          pfVar31[0xb] = (float)((uint)bVar12 * auVar41._44_4_ | (uint)!bVar12 * (int)pfVar31[0xb]);
          pfVar31[0xc] = (float)((uint)bVar13 * auVar41._48_4_ | (uint)!bVar13 * (int)pfVar31[0xc]);
          pfVar31[0xd] = (float)((uint)bVar14 * auVar41._52_4_ | (uint)!bVar14 * (int)pfVar31[0xd]);
          pfVar31[0xe] = (float)((uint)bVar15 * auVar41._56_4_ | (uint)!bVar15 * (int)pfVar31[0xe]);
          pfVar31[0xf] = (float)((uint)(bVar20 >> 7) * auVar41._60_4_ |
                                (uint)!(bool)(bVar20 >> 7) * (int)pfVar31[0xf]);
          uVar33 = uVar33 + 0x10;
        } while (((uVar22 - uVar30) + 0xf & 0xfffffffffffffff0) != uVar33);
      }
      lVar32 = lVar32 + 1;
      pfVar26 = pfVar26 + lVar21;
      pfVar28 = pfVar28 + lVar21;
    } while (lVar32 != (int)uVar2);
  }
  return;
}

Assistant:

void compute_integral_img_simd_int(uint8_t *gray_image, struct integral_image *iimage) {
    
    // Implementation adapted from:
    // https://stackoverflow.com/questions/46520275/how-to-speed-up-calculation-of-integral-image
    // https://github.com/ermig1979/Simd/blob/master/src/Simd/SimdAvx2Integral.cpp

    int data_width = iimage->data_width;
    int width = iimage->width;
    int height = iimage->height;

    __m256i MASK = _mm256_setr_epi64x(0x00000000000000FF, 0x000000000000FFFF, 0x0000000000FFFFFF, 0x00000000FFFFFFFF);
    __m256i PACK = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
    //__m256i ZERO = _mm256_set1_epi32(0);
    __m256i ZERO = _mm256_setzero_si256();

    uint32_t *iimage_idata = (uint32_t *) iimage->data;

    size_t aligned_width = width / 4 * 4;

    {
        __m256i row_sums = ZERO;
        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));
            
            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            // 
            _mm_storeu_si128((__m128i*)(iimage_idata + i), curr_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + i), curr_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }
        uint32_t row_sum = iimage_idata[i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[i];
            iimage_idata[i] = row_sum;
        }
    }

    for(size_t j = 1; j < height; ++j) {

        __m256i row_sums = ZERO;

        size_t i = 0;
        for(; i < aligned_width; i+=4) {

            // If (gray_image + i) has following uint8_t pixels: a b c d
            // a0000000 ab000000 abc00000 abcd0000
            __m256i img_rep_mask = _mm256_and_si256(_mm256_set1_epi32(*(uint32_t*)(gray_image + j * width + i)), MASK);
            
            // Summing together blocks of 8 uint8_t's and storing results
            // uint32_t eeee = a
            // uint32_t ffff = a + b
            // uint32_t gggg = a + b + c
            // uint32_t hhhh = a + b + c + d
            // eeee0000 ffff0000 gggg0000 hhhh0000
            __m256i img_sad_sum = _mm256_sad_epu8(img_rep_mask, ZERO);

            // Updating row_sum by adding previously computed img_sad_sum
            //   eeee0000 ffff0000 hhhh0000 hhhh0000
            // + iiii**** jjjj**** kkkk**** llll****
            // -------------------------------------
            //   mmmm**** nnnn**** oooo**** pppp****
            row_sums = _mm256_add_epi32(row_sums, img_sad_sum);

            // Permuting row_sum from first row to second and cutting off upper 128 bits
            // mmmm**** nnnn**** oooo**** pppp****
            // mmmmnnnn oooopppp ******** ********
            __m128i curr_row_sums = _mm256_castsi256_si128(_mm256_permutevar8x32_epi32(row_sums, PACK));

            // Loading row_sum from previous row
            __m128i prev_row_sums = _mm_loadu_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));
            //__m128i prev_row_sums = _mm_load_si128((__m128i *)(iimage_idata + (j-1) * data_width + i));

            // Adding curr_row_sums with prev_row_sums
            __m128i add_row_sums = _mm_add_epi32(curr_row_sums, prev_row_sums);

            // Storing 128 bits (4*uint32_t) in curr_row_sums back to memory
            _mm_storeu_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums); // For unaligned
            //_mm_store_si128((__m128i *)(iimage_idata + j * data_width + i), add_row_sums);
            
            // Updating row_sums to only include highest of four values (pppp)
            // mmmm**** nnnn**** oooo**** pppp****
            // pppp**** pppp**** pppp**** pppp****
            row_sums = _mm256_permute4x64_epi64(row_sums, 0xFF);

        }

        uint32_t row_sum = iimage_idata[j * data_width + i - 1] - iimage_idata[(j-1) * data_width + i - 1];
        for (; i < width; ++i) {
            row_sum += gray_image[j * width + i];
            iimage_idata[j * data_width + i] = row_sum + iimage_idata[(j-1) * data_width + i];
        }

    }

    
    float *iimage_data = iimage->data;

    __m256 factor = _mm256_set1_ps(1.0f / 255.0f);

    for (size_t j = 0; j < height; ++j) {

        size_t i = 0;
        for (; i < width - 7; i+=8) {

            __m256i v_int = _mm256_loadu_si256((__m256i *)(iimage_idata + j * data_width + i));
            //__m256i v_int = _mm256_load_si256((__m256i *)(iimage_idata + j * data_width + i));

            // AVX512 only :(
            //__m256 v_float = _mm256_cvtepu32_ps(v_int);
            __m256 v_float = _mm256_cvtepi32_ps(v_int);
            //__m256 v_float = _my_mm256_cvtepu32_ps(v_int);

            // Multiplying converted float with (1.0f/255.0f) 
            __m256 v_iimage = _mm256_mul_ps(factor, v_float);

            // Storing value back to memory
            _mm256_storeu_ps(iimage_data + j * data_width + i, v_iimage);

        } 

        for (; i < width; ++i) {
            iimage_data[j * data_width + i] = (1.0f / 255.0f) * ((float) iimage_idata[j * data_width + i]);
        }

    }
    

}